

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

string * __thiscall
tinyusdz::Path::full_path_name_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->_valid == false) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->_prim_part)._M_dataplus._M_p);
  if ((this->_prop_part)._M_string_length != 0) {
    ::std::operator+(&local_38,".",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->_prop_part);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_path_name() const {
    std::string s;
    if (!_valid) {
      s += "#INVALID#";
    }

    s += _prim_part;
    if (_prop_part.empty()) {
      return s;
    }

    s += "." + _prop_part;

    return s;
  }